

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_ChangeSound
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  int iVar2;
  FSectorTagIterator local_20;
  
  if (arg0 != 0) {
    local_20.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
    local_20.searchtag = arg0;
    uVar1 = FSectorTagIterator::Next(&local_20);
    if ((int)uVar1 < 0) {
      iVar2 = 0;
    }
    else {
      do {
        sectors[uVar1].seqType = (short)arg1;
        uVar1 = FSectorTagIterator::Next(&local_20);
      } while (-1 < (int)uVar1);
      iVar2 = 1;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

FUNC(LS_Sector_ChangeSound)
// Sector_ChangeSound (tag, sound)
{
	int secNum;
	bool rtn;

	if (!arg0)
		return false;

	rtn = false;
	FSectorTagIterator itr(arg0);
	while ((secNum = itr.Next()) >= 0)
	{
		sectors[secNum].seqType = arg1;
		rtn = true;
	}
	return rtn;
}